

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_var_def(SyntaxAnalyze *this)

{
  element_type *peVar1;
  string name_00;
  string name_01;
  string name_02;
  long lVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  shared_ptr<front::express::ExpressNode> *value_1;
  ArraySymbol *this_00;
  IntSymbol *this_01;
  pointer psVar8;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  irGenerator *this_02;
  SymbolTable *this_03;
  pointer psVar10;
  iterator __begin4;
  bool bVar11;
  undefined1 in_stack_fffffffffffffa1c [12];
  SymbolKind kind;
  undefined4 in_stack_fffffffffffffa2c;
  irGenerator *piVar12;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  int iVar13;
  SharedSyPtr symbol;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  init_values;
  shared_ptr<front::express::ExpressNode> var;
  undefined1 local_580 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inits;
  string addr;
  RightVal rightvalue2;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  dimensions;
  shared_ptr<front::express::ExpressNode> var_1;
  string initPtr;
  string name;
  SharedExNdPtr dimension;
  SharedSyPtr local_460;
  string valueName;
  __shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> local_430;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_420;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_410;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_400;
  undefined1 local_3e8 [32];
  string local_3c8 [32];
  string local_3a8;
  string local_388 [32];
  string local_368;
  string local_348 [32];
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  string local_c8;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  dimension.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  dimension.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dimensions.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dimensions.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dimensions.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  init_values.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  init_values.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  init_values.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  match_one_word(this,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)&inits,
             (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this->matched_index);
  std::__cxx11::string::operator=((string *)&name,(string *)&inits);
  std::__cxx11::string::~string((string *)&inits);
  bVar4 = try_word(this,1,LBRACK);
  iVar13 = CONCAT31((int3)((uint)in_stack_fffffffffffffa34 >> 8),bVar4);
  kind = INT;
  if (bVar4) {
    kind = Array;
    while (bVar4 = try_word(this,1,LBRACK), bVar4) {
      match_one_word(this,LBRACK);
      gm_exp((SyntaxAnalyze *)&inits);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&dimension.
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&inits);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back(&dimensions,
                  (value_type *)
                  &dimension.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
      match_one_word(this,RBRACK);
    }
  }
  bVar4 = try_word(this,1,ASSIGN);
  if (bVar4) {
    match_one_word(this,ASSIGN);
    bVar4 = try_word(this,1,LBRACE);
    if (bVar4) {
      match_one_word(this,LBRACE);
      gm_init_val(this,&init_values,&dimensions,0);
      match_one_word(this,RBRACE);
    }
    else {
      gm_init_val(this,&init_values,&dimensions,0);
    }
  }
  if ((char)iVar13 == '\0') {
    this_01 = (IntSymbol *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_2c8,(string *)&name);
    front::symbol::IntSymbol::IntSymbol(this_01,&local_2c8,this->layer_num,false,0);
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::IntSymbol>
              (&symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,this_01
              );
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::string((string *)&local_2e8,(string *)&name);
    local_3e8._0_8_ = (pointer)0x0;
    local_3e8._8_8_ = 0;
    local_3e8._16_8_ = 0;
    iVar5 = 0;
    irGenerator::irGenerator::ir_declare_value
              (&this->irGenerator,&local_2e8,INT,
               (symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->id,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3e8,Var,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_3e8);
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  else {
    inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = (ArraySymbol *)operator_new(0x78);
    std::__cxx11::string::string((string *)&local_308,(string *)&name);
    front::symbol::IntSymbol::getHolderIntSymbol();
    front::symbol::ArraySymbol::ArraySymbol
              (this_00,&local_308,&local_460,this->layer_num,false,false);
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::ArraySymbol>
              (&symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,this_00
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_460.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_308);
    psVar8 = dimensions.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (p_Var9 = &(dimensions.
                    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
        psVar10 = init_values.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        p_Var9 != &psVar8->
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
        p_Var9 = p_Var9 + 1) {
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 p_Var9);
      std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                ((shared_ptr<front::symbol::Symbol> *)&rightvalue2);
      lVar2 = CONCAT44(rightvalue2.
                       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       _M_u._4_4_,
                       rightvalue2.
                       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       _M_u._M_first._M_storage);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_410,
                 &var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)(lVar2 + 0x48),(value_type *)&local_410);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_410._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&rightvalue2.
                         super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         _M_u + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    if (this->layer_num == this->_initLayerNum) {
      if (init_values.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          init_values.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar5 = 0;
        while( true ) {
          std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                    ((shared_ptr<front::symbol::Symbol> *)&var);
          iVar6 = front::symbol::ArraySymbol::getLen
                            ((ArraySymbol *)
                             var.
                             super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&var.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (iVar6 <= iVar5) break;
          var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               ((ulong)var.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr & 0xffffffff00000000);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&inits,(uint *)&var);
          iVar5 = iVar5 + 1;
        }
      }
      else {
        for (p_Var9 = &(init_values.
                        super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
            p_Var9 != &psVar10->
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
            p_Var9 = p_Var9 + 1) {
          std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&var.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                     p_Var9);
          if ((var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_type == CNS) {
            rightvalue2.
            super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
            super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
            super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
            super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
            super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first.
            _M_storage = (_Uninitialized<int,_true>)
                         (var.
                          super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_value;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&inits,(uint *)&rightvalue2);
          }
          else {
            rightvalue2.
            super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
            super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
            super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
            super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
            super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first.
            _M_storage = (_Uninitialized<int,_true>)0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&inits,(uint *)&rightvalue2);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&var.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
    }
    std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
              ((shared_ptr<front::symbol::Symbol> *)&var);
    iVar5 = front::symbol::ArraySymbol::getLen
                      ((ArraySymbol *)
                       var.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    bVar4 = irGenerator::TopLocalSmallArrayLength < iVar5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar11 = init_values.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             init_values.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::string((string *)&local_328,(string *)&name);
    iVar6 = (symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            id;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_400,&inits);
    std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
              ((shared_ptr<front::symbol::Symbol> *)&var);
    iVar5 = front::symbol::ArraySymbol::getLen
                      ((ArraySymbol *)
                       var.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    irGenerator::irGenerator::ir_declare_value
              (&this->irGenerator,&local_328,kind,iVar6,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_400,
               ((uint)bVar4 * 2 - (uint)bVar11) + SmallInit,iVar5);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_400);
    std::__cxx11::string::~string((string *)&local_328);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  piVar12 = (irGenerator *)CONCAT44(in_stack_fffffffffffffa2c,kind);
  if (init_values.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      init_values.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string(local_348,(string *)&name);
    this_02 = &this->irGenerator;
    name_00._4_12_ = in_stack_fffffffffffffa1c;
    name_00._M_dataplus._M_p._0_4_ = iVar5;
    name_00.field_2._M_allocated_capacity._0_4_ = (int)this_02;
    name_00.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this_02 >> 0x20);
    name_00.field_2._8_4_ = in_stack_fffffffffffffa30;
    name_00.field_2._12_4_ = iVar13;
    irGenerator::irGenerator::getVarName(&valueName,this_02,name_00,(uint32_t)local_348);
    std::__cxx11::string::~string(local_348);
    inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    iVar6 = (**(symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->_vptr_Symbol)();
    if (iVar6 == 2) {
      initPtr._M_dataplus._M_p = (pointer)&initPtr.field_2;
      initPtr._M_string_length = 0;
      initPtr.field_2._M_local_buf[0] = '\0';
      var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((ulong)var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr & 0xffffffff00000000);
      local_580[0x10] = '\0';
      rightvalue2.
      super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first.
      _M_storage = (_Uninitialized<int,_true>)0;
      rightvalue2.
      super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
      if (this->layer_num == this->_initLayerNum) {
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&addr,this_02,Ptr);
        std::__cxx11::string::operator=((string *)&initPtr,(string *)&addr);
        std::__cxx11::string::~string((string *)&addr);
        std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
        _Variant_storage<1ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,std::__cxx11::string> *)&local_190,&initPtr);
        std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
        _Variant_storage<1ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,std::__cxx11::string> *)&local_1b8,&valueName);
        irGenerator::irGenerator::ir_ref(this_02,(LeftVal *)&local_190,(LeftVal *)&local_1b8,false);
        std::__detail::__variant::
        _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_1b8);
        std::__detail::__variant::
        _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_190);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&initPtr);
      }
      psVar8 = init_values.
               super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar6 = 0;
      iVar13 = 0;
      for (p_Var9 = &(init_values.
                      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
          p_Var9 != &psVar8->
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
          p_Var9 = p_Var9 + 1) {
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&var_1.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                   p_Var9);
        iVar7 = (**(symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->_vptr_Symbol)();
        if (iVar7 == 2) {
          std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                    ((shared_ptr<front::symbol::Symbol> *)&addr);
          _Var3 = addr._M_dataplus;
          std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_420,
                     &var_1.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
          std::
          vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                       *)(_Var3._M_p + 0x60),(value_type *)&local_420);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_420._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&addr._M_string_length);
        }
        if ((var_1.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_type == VAR) {
          std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                    ((variant<int,int,std::__cxx11::string> *)&inits,
                     &(var_1.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_name);
LAB_001819ef:
          if (iVar6 == 0) {
            std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
            _Variant_storage<1ul,std::__cxx11::string&>
                      ((_Variant_storage<false,int,std::__cxx11::string> *)&local_168,&initPtr);
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_a8,
                              (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&inits);
            irGenerator::irGenerator::ir_store(this_02,(LeftVal *)&local_168,(RightVal *)&local_a8);
            std::__detail::__variant::
            _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_a8);
            std::__detail::__variant::
            _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_168);
          }
          else {
            addr._M_dataplus._M_p = (pointer)&addr.field_2;
            addr._M_string_length = 0;
            addr.field_2._M_local_buf[0] = '\0';
            irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_c8,this_02,Ptr);
            std::__cxx11::string::operator=((string *)&addr,(string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_c8);
            local_c8._M_dataplus._M_p._0_4_ = iVar13;
            std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
                      ((variant<int,int,std::__cxx11::string> *)&var,(int *)&local_c8);
            std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
            _Variant_storage<1ul,std::__cxx11::string&>
                      ((_Variant_storage<false,int,std::__cxx11::string> *)&local_f0,&addr);
            std::__detail::__variant::_Variant_storage<false,int,int,std::__cxx11::string>::
            _Variant_storage<2ul,std::__cxx11::string&>
                      ((_Variant_storage<false,int,int,std::__cxx11::string> *)&local_118,&initPtr);
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_58,
                              (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&var);
            irGenerator::irGenerator::ir_op
                      (this_02,(LeftVal *)&local_f0,(RightVal *)&local_118,(RightVal *)&local_58,Add
                      );
            std::__detail::__variant::
            _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_58);
            std::__detail::__variant::
            _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_118);
            std::__detail::__variant::
            _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_f0);
            std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
            _Variant_storage<1ul,std::__cxx11::string&>
                      ((_Variant_storage<false,int,std::__cxx11::string> *)&local_140,&addr);
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_80,
                              (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&inits);
            irGenerator::irGenerator::ir_store(this_02,(LeftVal *)&local_140,(RightVal *)&local_80);
            std::__detail::__variant::
            _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_80);
            std::__detail::__variant::
            _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_140);
            std::__cxx11::string::~string((string *)&addr);
          }
        }
        else if (((var_1.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_type == CNS) &&
                ((var_1.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_value != 0)) {
          std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                    ((variant<int,int,std::__cxx11::string> *)&inits,
                     &(var_1.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_value);
          goto LAB_001819ef;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&var_1.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        iVar13 = iVar13 + 4;
        iVar6 = iVar6 + -1;
      }
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&rightvalue2);
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&var);
      piVar12 = this_02;
      std::__cxx11::string::~string((string *)&initPtr);
    }
    else {
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&initPtr,
                 &(init_values.
                   super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
      if (*(int *)initPtr._M_dataplus._M_p == 0) {
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                  ((variant<int,int,std::__cxx11::string> *)&inits,
                   (int *)(initPtr._M_dataplus._M_p + 8));
      }
      else {
        std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                  ((variant<int,int,std::__cxx11::string> *)&inits,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (initPtr._M_dataplus._M_p + 0x10));
      }
      if (this->layer_num == this->_initLayerNum) {
        var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_580;
        var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_580[0] = 0;
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_((string *)&rightvalue2,this_02,Ptr);
        std::__cxx11::string::operator=((string *)&var,(string *)&rightvalue2);
        std::__cxx11::string::~string((string *)&rightvalue2);
        std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
        _Variant_storage<1ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,std::__cxx11::string> *)&local_1e0,(string *)&var);
        piVar12 = this_02;
        std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
        _Variant_storage<1ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,std::__cxx11::string> *)&local_208,&valueName);
        irGenerator::irGenerator::ir_ref(this_02,(LeftVal *)&local_1e0,(LeftVal *)&local_208,false);
        std::__detail::__variant::
        _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_208);
        std::__detail::__variant::
        _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_1e0);
        std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
        _Variant_storage<1ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,std::__cxx11::string> *)&local_230,&var);
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_258,
                          (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&inits);
        irGenerator::irGenerator::ir_store(this_02,(LeftVal *)&local_230,(RightVal *)&local_258);
        std::__detail::__variant::
        _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_258);
        std::__detail::__variant::
        _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_230);
        std::__cxx11::string::~string((string *)&var);
      }
      else {
        piVar12 = this_02;
        std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
        _Variant_storage<1ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,std::__cxx11::string> *)&local_280,&valueName);
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_2a8,
                          (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&inits);
        irGenerator::irGenerator::ir_assign(this_02,(LeftVal *)&local_280,(RightVal *)&local_2a8);
        std::__detail::__variant::
        _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_2a8);
        std::__detail::__variant::
        _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_280);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&initPtr._M_string_length);
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&inits);
    std::__cxx11::string::~string((string *)&valueName);
  }
  this_03 = &this->symbolTable;
  std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_430,
             &symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>);
  symbolTable::SymbolTable::push_symbol(this_03,(SharedSyPtr *)&local_430);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_430._M_refcount);
  if ((init_values.
       super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       init_values.
       super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (this->layer_num == this->_initLayerNum)) {
    iVar6 = (**(symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->_vptr_Symbol)();
    psVar8 = init_values.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6 == 2) {
      rightvalue2.
      super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first.
      _M_storage._0_1_ = 1;
      inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (psVar10 = init_values.
                     super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar8;
          psVar10 = psVar10 + 1) {
        peVar1 = (psVar10->
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        if (peVar1->_type != CNS) {
          rightvalue2.
          super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
          super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
          super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
          super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
          super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first.
          _M_storage = (_Uninitialized<int,_true>)
                       ((uint)rightvalue2.
                              super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>
                              .super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>
                              .super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                              super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                              super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>
                              ._M_u._M_first._M_storage & 0xffffff00);
          goto LAB_00181f30;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&inits,&peVar1->_value);
      }
      std::make_shared<front::optimization::bmir_variable_table::VarArray,bool&>((bool *)&var);
      std::vector<int,std::allocator<int>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)
                 &(var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_value,
                 inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::__cxx11::string::string
                (local_388,
                 (string *)
                 &(symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name);
      name_01._4_12_ = in_stack_fffffffffffffa1c;
      name_01._M_dataplus._M_p._0_4_ = iVar5;
      name_01.field_2._M_allocated_capacity._0_4_ = (int)piVar12;
      name_01.field_2._M_allocated_capacity._4_4_ = (int)((ulong)piVar12 >> 0x20);
      name_01.field_2._8_4_ = in_stack_fffffffffffffa30;
      name_01.field_2._12_4_ = iVar13;
      irGenerator::irGenerator::getVarName
                (&local_368,&this->irGenerator,name_01,(uint32_t)local_388);
      optimization::bmir_variable_table::BmirVariableTable::insertVarArray
                (&this->bmirVariableTable,&local_368,
                 (shared_ptr<front::optimization::bmir_variable_table::VarArray> *)&var);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string(local_388);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
LAB_00181f30:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&inits);
    }
    else {
      iVar6 = (**(symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_vptr_Symbol)();
      if (iVar6 == 0) {
        var.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT71(var.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._1_7_,1);
        for (psVar8 = init_values.
                      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            psVar8 != init_values.
                      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; psVar8 = psVar8 + 1) {
          peVar1 = (psVar8->
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (peVar1->_type != CNS) goto LAB_00181f3d;
          this_03 = (SymbolTable *)(ulong)(uint)peVar1->_value;
        }
        std::make_shared<front::optimization::bmir_variable_table::VarSingle,bool&>((bool *)&inits);
        inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[1] = (uint)this_03;
        std::__cxx11::string::string
                  (local_3c8,
                   (string *)
                   &(symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_name);
        name_02._4_12_ = in_stack_fffffffffffffa1c;
        name_02._M_dataplus._M_p._0_4_ = iVar5;
        name_02.field_2._M_allocated_capacity._0_4_ = (int)piVar12;
        name_02.field_2._M_allocated_capacity._4_4_ = (int)((ulong)piVar12 >> 0x20);
        name_02.field_2._8_4_ = in_stack_fffffffffffffa30;
        name_02.field_2._12_4_ = iVar13;
        irGenerator::irGenerator::getVarName
                  (&local_3a8,&this->irGenerator,name_02,(uint32_t)local_3c8);
        optimization::bmir_variable_table::BmirVariableTable::insertVarSingle
                  (&this->bmirVariableTable,&local_3a8,
                   (shared_ptr<front::optimization::bmir_variable_table::VarSingle> *)&inits);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string(local_3c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
    }
  }
LAB_00181f3d:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(&init_values);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(&dimensions);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dimension.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void SyntaxAnalyze::gm_var_def() {
  string name;
  SymbolKind kind;
  SharedExNdPtr dimension;
  vector<SharedExNdPtr> dimensions;
  vector<SharedExNdPtr> init_values;
  SharedSyPtr symbol;
  irGenerator::localArrayInitType initType;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    kind = SymbolKind::Array;
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      dimension = gm_const_exp();
      dimensions.push_back(dimension);
      match_one_word(Token::RBRACK);
    }
  } else {
    kind = SymbolKind::INT;
  }

  if (try_word(1, Token::ASSIGN)) {
    match_one_word(Token::ASSIGN);
    if (try_word(1, Token::LBRACE)) {
      match_one_word(Token::LBRACE);
      gm_init_val(init_values, dimensions, 0);
      match_one_word(Token::RBRACE);
    } else {
      gm_init_val(init_values, dimensions, 0);
    }
  }

  if (kind == SymbolKind::INT) {
    symbol.reset(new IntSymbol(name, layer_num, false));
    irGenerator.ir_declare_value(name, kind, symbol->getId(), {});
  } else {
    vector<uint32_t> inits;

    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 layer_num, false, false));
    for (auto var : dimensions) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(var);
    }

    if (inGlobalLayer()) {
      if (init_values.empty()) {
        for (int i = 0;
             i < std::static_pointer_cast<ArraySymbol>(symbol)->getLen(); i++) {
          inits.push_back(0);
        }
      } else {
        for (auto value : init_values) {
          if (value->_type == NodeType::CNS) {
            inits.push_back(value->_value);
          } else {
            inits.push_back(0);
          }
        }
      }
    }

    if (std::static_pointer_cast<ArraySymbol>(symbol)->getLen() <=
        irGenerator::TopLocalSmallArrayLength) {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::SmallInit;
      } else {
        initType = irGenerator::localArrayInitType::Small;
      }
    } else {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::BigInit;
      } else {
        initType = irGenerator::localArrayInitType::BigNoInit;
      }
    }

    irGenerator.ir_declare_value(
        name, kind, symbol->getId(), inits, initType,
        std::static_pointer_cast<ArraySymbol>(symbol)->getLen());
  }

  if (init_values.size() > 0) {
    string valueName = irGenerator.getVarName(name, symbol->getId());
    irGenerator::RightVal rightVal;

    if (symbol->kind() == SymbolKind::Array) {
      string initPtr;
      bool needAssgin;
      int offset = 0;
      RightVal rightvalue1;
      RightVal rightvalue2;

      if (inGlobalLayer()) {
        initPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(initPtr, valueName);
      } else {
        initPtr = valueName;
      }

      for (auto var : init_values) {
        needAssgin = false;
        if (symbol->kind() == SymbolKind::Array) {
          std::static_pointer_cast<ArraySymbol>(symbol)->addValue(var);
        }

        if (var->_type == NodeType::CNS && var->_value != 0) {
          rightVal.emplace<0>(var->_value);
          needAssgin = true;
        } else if (var->_type == NodeType::VAR) {
          rightVal.emplace<2>(var->_name);
          needAssgin = true;
        }

        if (needAssgin) {
          if (offset > 0) {
            string addr;

            addr = irGenerator.getNewTmpValueName(mir::types::TyKind::Ptr);
            rightvalue1.emplace<0>(offset * mir::types::INT_SIZE);
            irGenerator.ir_op(addr, initPtr, rightvalue1, Op::Add);
            irGenerator.ir_store(addr, rightVal);
          } else {
            irGenerator.ir_store(initPtr, rightVal);
          }
        }
        offset++;
      }
    } else {
      SharedExNdPtr var = init_values.front();

      if (var->_type == NodeType::CNS) {
        rightVal.emplace<0>(var->_value);
      } else {
        rightVal.emplace<2>(var->_name);
      }

      if (inGlobalLayer()) {
        string addrTmp;

        addrTmp = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(addrTmp, valueName);
        irGenerator.ir_store(addrTmp, rightVal);
      } else {
        irGenerator.ir_assign(valueName, rightVal);
      }
    }
  }
  symbolTable.push_symbol(symbol);

  if (!init_values.empty()) {
    if (inGlobalLayer()) {
      if (symbol->kind() == SymbolKind::Array) {
        bool isConst = true;
        std::vector<int32_t> constValues;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValues.push_back(value->_value);
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarArray>
              varArray =
                  std::make_shared<optimization::bmir_variable_table::VarArray>(
                      isConst);

          varArray->initValues.assign(constValues.begin(), constValues.end());
          bmirVariableTable.insertVarArray(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varArray);
        }
      } else if (symbol->kind() == SymbolKind::INT) {
        bool isConst = true;
        int32_t constValue;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValue = value->_value;
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarSingle>
              varSingle = std::make_shared<
                  optimization::bmir_variable_table::VarSingle>(isConst);

          varSingle->initValue = constValue;
          bmirVariableTable.insertVarSingle(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varSingle);
        }
      }
    }
  }
}